

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_file_utilities.cpp
# Opt level: O1

ON_wString __thiscall
ON_FileSystemPath::FileNameFromPath(ON_FileSystemPath *this,wchar_t *path,bool bIncludeExtension)

{
  undefined7 in_register_00000011;
  
  ON_wString::ON_wString((ON_wString *)this);
  if ((int)CONCAT71(in_register_00000011,bIncludeExtension) == 0) {
    SplitPath(path,(ON_wString *)0x0,(ON_wString *)0x0,(ON_wString *)this,(ON_wString *)0x0);
  }
  else {
    SplitPath(path,(ON_wString *)0x0,(ON_wString *)0x0,(ON_wString *)this);
  }
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_FileSystemPath::FileNameFromPath(
  const wchar_t* path,
  bool bIncludeExtension
)
{
  ON_wString fname;
  if ( bIncludeExtension )
    ON_FileSystemPath::SplitPath(path, nullptr, nullptr, &fname);
  else
    ON_FileSystemPath::SplitPath(path, nullptr, nullptr, &fname, nullptr);
  return fname;
}